

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_lattice.c
# Opt level: O3

void ps_lattice_link2itor(ps_seg_t *seg,ps_latlink_t *link,int to)

{
  ps_latnode_s **pppVar1;
  logmath_t *lmath;
  ps_latlink_t *ppVar2;
  ps_search_t *ppVar3;
  int iVar4;
  ps_latlink_s *ppVar5;
  char *pcVar6;
  long lVar7;
  int32 w1;
  latlink_list_t *plVar8;
  int32 w2;
  ps_latnode_s *ppVar9;
  ps_latnode_s *ppVar10;
  
  if (to == 0) {
    lmath = seg->search->acmod->lmath;
    ppVar9 = link->from;
    seg->ef = link->ef;
    iVar4 = (link->beta + link->alpha) - *(int *)&seg[1].search;
    seg->prob = iVar4;
    ppVar10 = ppVar9;
    if (ppVar9 == (ps_latnode_s *)0x0) {
      ppVar9 = (ps_latnode_s *)0x0;
    }
    else {
      do {
        for (plVar8 = ppVar10->exits; plVar8 != (latlink_list_t *)0x0; plVar8 = plVar8->next) {
          ppVar2 = plVar8->link;
          if (ppVar2 != link) {
            iVar4 = logmath_add(lmath,iVar4,(ppVar2->beta + ppVar2->alpha) - *(int *)&seg[1].search)
            ;
            seg->prob = iVar4;
          }
        }
        pppVar1 = &ppVar10->alt;
        ppVar10 = *pppVar1;
      } while (*pppVar1 != (ps_latnode_s *)0x0);
    }
  }
  else {
    ppVar9 = link->to;
    seg->ef = ppVar9->lef;
    seg->prob = 0;
  }
  iVar4 = ppVar9->wid;
  ppVar3 = seg->search;
  if ((long)iVar4 < 0) {
    pcVar6 = (char *)0x0;
  }
  else {
    pcVar6 = ppVar3->dict->word[iVar4].word;
  }
  seg->text = pcVar6;
  seg->wid = iVar4;
  seg->sf = ppVar9->sf;
  seg->ascr = link->ascr << 10;
  iVar4 = strcmp(ppVar3->type,"ngram");
  if (iVar4 == 0) {
    ppVar5 = link->best_prev;
    if (ppVar5 == (ps_latlink_s *)0x0) {
      if (to == 0) {
        seg->lscr = 0;
        iVar4 = 1;
        lVar7 = 0x30;
        goto LAB_001125a0;
      }
      w2 = link->to->basewid;
      w1 = link->from->basewid;
LAB_0011258f:
      iVar4 = ngram_bg_score((ngram_model_t *)ppVar3[1].vt,w2,w1,&seg->lback);
    }
    else {
      if (to == 0) {
        pppVar1 = &ppVar5->from;
        ppVar5 = ppVar5->best_prev;
        w2 = link->from->basewid;
        w1 = (*pppVar1)->basewid;
        if (ppVar5 == (ps_latlink_s *)0x0) goto LAB_0011258f;
      }
      else {
        w2 = link->to->basewid;
        w1 = link->from->basewid;
      }
      iVar4 = ngram_tg_score((ngram_model_t *)ppVar3[1].vt,w2,w1,ppVar5->from->basewid,&seg->lback);
    }
    iVar4 = iVar4 >> 10;
  }
  else {
    seg->lback = 1;
    iVar4 = 0;
  }
  lVar7 = 0x28;
LAB_001125a0:
  *(int *)((long)&seg->vt + lVar7) = iVar4;
  return;
}

Assistant:

static void
ps_lattice_link2itor(ps_seg_t *seg, ps_latlink_t *link, int to)
{
    dag_seg_t *itor = (dag_seg_t *)seg;
    ps_latnode_t *node;

    if (to) {
        node = link->to;
        seg->ef = node->lef;
        seg->prob = 0; /* norm + beta - norm */
    }
    else {
        latlink_list_t *x;
        ps_latnode_t *n;
        logmath_t *lmath = ps_search_acmod(seg->search)->lmath;

        node = link->from;
        seg->ef = link->ef;
        seg->prob = link->alpha + link->beta - itor->norm;
        /* Sum over all exits for this word and any alternate
           pronunciations at the same frame. */
        for (n = node; n; n = n->alt) {
            for (x = n->exits; x; x = x->next) {
                if (x->link == link)
                    continue;
                seg->prob = logmath_add(lmath, seg->prob,
                                        x->link->alpha + x->link->beta - itor->norm);
            }
        }
    }
    seg->text = dict_wordstr(ps_search_dict(seg->search), node->wid);
    seg->wid = node->wid;
    seg->sf = node->sf;
    seg->ascr = link->ascr << SENSCR_SHIFT;
    /* Compute language model score from best predecessors. */
    ps_lattice_compute_lscr(seg, link, to);
}